

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::RenditionAdapterObeysHorizontalLimits(RendererTests *this)

{
  allocator local_111;
  string local_110 [32];
  LocationInfo local_f0;
  uchar local_c8 [8];
  uint8_t reference [30];
  zero local_a1;
  agge_vector<int> local_a0;
  undefined1 local_98 [8];
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  r;
  undefined1 local_50 [8];
  bitmap<unsigned_char,_2UL,_0UL> bitmap;
  blender<unsigned_char,_unsigned_char> blender;
  uint8_t covers [5];
  RendererTests *this_local;
  
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0xe1;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x9013ff51;
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender
            ((blender<unsigned_char,_unsigned_char> *)&bitmap._width);
  tests::mocks::bitmap<unsigned_char,_2UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_2UL,_0UL> *)local_50,8,3);
  local_a0 = zero::operator_cast_to_agge_vector(&local_a1);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::adapter((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
             *)local_98,(bitmap<unsigned_char,_2UL,_0UL> *)local_50,local_a0,(rect_i *)0x0,
            (blender<unsigned_char,_unsigned_char> *)&bitmap._width);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
           *)local_98,0);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_98,-2,3,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_98,5,5,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
           *)local_98,1);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_98,-5,5,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_98,8,5,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
           *)local_98,2);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_98,-3,5,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_98,7,4,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  reference[8] = '\0';
  reference[9] = '\0';
  reference[10] = '\0';
  reference[0xb] = '\0';
  reference[0xc] = 0x90;
  reference[0xd] = 0xe1;
  reference[0xe] = '\0';
  reference[0xf] = '\0';
  reference[0x10] = '\0';
  reference[0x11] = '\0';
  reference[0x12] = '\0';
  reference[0x13] = 'Q';
  reference[0x14] = '\0';
  reference[0x15] = '\0';
  local_c8[0] = '\x13';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = 'Q';
  local_c8[6] = 0xff;
  local_c8[7] = '\x13';
  reference[0] = '\0';
  reference[1] = '\0';
  reference[2] = '\0';
  reference[3] = '\0';
  reference[4] = '\0';
  reference[5] = '\0';
  reference[6] = '\0';
  reference[7] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_111);
  ut::LocationInfo::LocationInfo(&local_f0,(string *)local_110,0x2b1);
  ut::are_equal<unsigned_char,30ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [30])local_c8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,&local_f0);
  ut::LocationInfo::~LocationInfo(&local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  tests::mocks::bitmap<unsigned_char,_2UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_2UL,_0UL> *)local_50);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender
            ((blender<unsigned_char,_unsigned_char> *)&bitmap._width);
  return;
}

Assistant:

test( RenditionAdapterObeysHorizontalLimits )
			{
				// INIT
				uint8_t covers[] = { 0x51, 0xFF, 0x13, 0x90, 0xE1, };
				mocks::blender<uint8_t, uint8_t> blender;
				mocks::bitmap<uint8_t, 2> bitmap(8, 3);
				renderer::adapter< mocks::bitmap<uint8_t, 2>, mocks::blender<uint8_t, uint8_t> > r(bitmap, zero(), 0, blender);

				// ACT
				r.set_y(0);
				r(-2, 3, covers);
				r(5, 5, covers);
				
				r.set_y(1);
				r(-5, 5, covers);
				r(8, 5, covers);
				
				r.set_y(2);
				r(-3, 5, covers);
				r(7, 4, covers);

				// ASSERT
				uint8_t reference[] = {
					0x13, 0x00, 0x00, 0x00, 0x00, 0x51, 0xFF, 0x13, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,	0x00, 0x00, 0x00,
					0x90, 0xE1, 0x00, 0x00, 0x00, 0x00, 0x00, 0x51, 0x00, 0x00,
				};

				assert_equal(reference, bitmap.data);
			}